

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

void ZSTD_ldm_makeEntryAndInsertByTag
               (ldmState_t *ldmState,U64 rollingHash,U32 hBits,U32 offset,ldmParams_t ldmParams)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  bVar3 = (byte)ldmParams.hashEveryLog;
  bVar2 = (byte)(0x20 - hBits);
  if (0x20 - hBits < ldmParams.hashEveryLog) {
    uVar5 = (uint)rollingHash;
  }
  else {
    uVar5 = (uint)(rollingHash >> (bVar2 - bVar3 & 0x3f));
  }
  if ((-1 << (bVar3 & 0x1f) ^ uVar5 & ~(-1 << (bVar3 & 0x1f))) != 0xffffffff) {
    return;
  }
  uVar4 = 0;
  if (hBits != 0) {
    uVar4 = rollingHash >> (-(char)hBits & 0x3fU) & 0xffffffff;
  }
  pBVar1 = ldmState->bucketOffsets;
  ldmState->hashTable[(uVar4 << ((byte)ldmParams.bucketSizeLog & 0x3f)) + (ulong)pBVar1[uVar4]] =
       (ldmEntry_t)((ulong)offset | (rollingHash >> (bVar2 & 0x3f)) << 0x20);
  pBVar1[uVar4] = ~(byte)(-1 << ((byte)ldmParams.bucketSizeLog & 0x1f)) & pBVar1[uVar4] + 1;
  return;
}

Assistant:

static void ZSTD_ldm_makeEntryAndInsertByTag(ldmState_t* ldmState,
                                             U64 const rollingHash,
                                             U32 const hBits,
                                             U32 const offset,
                                             ldmParams_t const ldmParams)
{
    U32 const tag = ZSTD_ldm_getTag(rollingHash, hBits, ldmParams.hashEveryLog);
    U32 const tagMask = ((U32)1 << ldmParams.hashEveryLog) - 1;
    if (tag == tagMask) {
        U32 const hash = ZSTD_ldm_getSmallHash(rollingHash, hBits);
        U32 const checksum = ZSTD_ldm_getChecksum(rollingHash, hBits);
        ldmEntry_t entry;
        entry.offset = offset;
        entry.checksum = checksum;
        ZSTD_ldm_insertEntry(ldmState, hash, entry, ldmParams);
    }
}